

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.hpp
# Opt level: O0

void __thiscall Excel::Book::Book(Book *this,string *fileName)

{
  _Ios_Openmode _Var1;
  string *in_RSI;
  IStorage *in_RDI;
  ifstream fileStream;
  string *in_stack_00000180;
  IStorage *in_stack_00000188;
  istream *in_stack_00000190;
  undefined1 local_218 [520];
  string *local_10;
  
  local_10 = in_RSI;
  IStorage::IStorage(in_RDI);
  in_RDI->_vptr_IStorage = (_func_int **)&PTR__Book_00165620;
  std::
  vector<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>,_std::allocator<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>_>_>
  ::vector((vector<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>,_std::allocator<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>_>_>
            *)0x12ac75);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            *)0x12ac88);
  *(undefined4 *)&in_RDI[7]._vptr_IStorage = 0xffffffff;
  _Var1 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(local_218,local_10,_Var1);
  Parser::loadBook(in_stack_00000190,in_stack_00000188,in_stack_00000180);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

inline
Book::Book( const std::string & fileName )
	:	m_dateMode( DateMode::Unknown )
{
	std::ifstream fileStream( fileName, std::ios::in | std::ios::binary );
	Parser::loadBook( fileStream, *this, fileName );
}